

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.hpp
# Opt level: O1

istream * utility::read<std::vector<short,std::allocator<short>>>
                    (istream *stream,vector<short,_std::allocator<short>_> *values)

{
  pointer psVar1;
  long *plVar2;
  short *value;
  pointer psVar3;
  int64_t n;
  size_t size;
  undefined8 local_30;
  size_type local_28;
  
  local_28 = 0;
  plVar2 = (long *)std::istream::read((char *)stream,(long)&local_28);
  if ((*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) == 0) {
    std::vector<short,_std::allocator<short>_>::resize(values,local_28);
    psVar3 = (values->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
             super__Vector_impl_data._M_start;
    psVar1 = (values->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (psVar3 != psVar1) {
      do {
        local_30 = 0;
        std::istream::read((char *)stream,(long)&local_30);
        *psVar3 = (short)local_30;
        psVar3 = psVar3 + 1;
      } while (psVar3 != psVar1);
    }
  }
  return stream;
}

Assistant:

std::istream & read (std::istream & stream, Container & values)
    {
        auto size = std::size_t{};
        if (burst::trivial_read(stream, size))
        {
            values.resize(size);

            for (auto & value: values)
            {
                auto n = std::int64_t{};
                burst::trivial_read(stream, n);
                value = static_cast<typename Container::value_type>(n);
            }
        }

        return stream;
    }